

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_neon_tbl_aarch64(uint32_t ireg,uint32_t def,void *vn,uint32_t maxindex)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = 0;
  for (uVar3 = 0; uVar3 < 0x20; uVar3 = uVar3 + 8) {
    bVar2 = (byte)uVar3;
    uVar4 = ireg >> (bVar2 & 0x1f);
    if ((uVar4 & 0xff) < maxindex) {
      uVar4 = ((uint)(*(ulong *)((long)vn + (ulong)(uVar4 & 0xf8)) >> ((byte)(uVar4 << 3) & 0x3f)) &
              0xff) << (bVar2 & 0x1f);
    }
    else {
      uVar4 = 0xff << (bVar2 & 0x1f) & def;
    }
    uVar1 = uVar1 | uVar4;
  }
  return uVar1;
}

Assistant:

uint32_t HELPER(neon_tbl)(uint32_t ireg, uint32_t def, void *vn,
                          uint32_t maxindex)
{
    uint32_t val, shift;
    uint64_t *table = vn;

    val = 0;
    for (shift = 0; shift < 32; shift += 8) {
        uint32_t index = (ireg >> shift) & 0xff;
        if (index < maxindex) {
            uint32_t tmp = (table[index >> 3] >> ((index & 7) << 3)) & 0xff;
            val |= tmp << shift;
        } else {
            val |= def & (0xff << shift);
        }
    }
    return val;
}